

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeEncodeTest.cpp
# Opt level: O0

int main(void)

{
  time_t tVar1;
  ANN *pAVar2;
  BSA_SpikeEncodingSynapse *this;
  Population *n_from;
  BSA_SpikeEncodingSynapse_param *param;
  ostream *this_00;
  BSA_SpikeEncodingSynapse_param *this_01;
  Network *this_02;
  Network n;
  Network_param *n_param;
  RateCodingSynapse *s2;
  BSA_SpikeEncodingSynapse *s1;
  BSA_SpikeEncodingSynapse_param *params1;
  Population *p3;
  ArtificialPopulation *p2;
  Population *p1;
  SignalGenerator_param *paramp1;
  ANN *ann;
  Synapse *in_stack_fffffffffffffe68;
  ANN *in_stack_fffffffffffffe70;
  allocator<char> *in_stack_fffffffffffffea0;
  Population *n_to;
  char *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  ArtificialPopulation *this_03;
  string *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  int size;
  ANN *in_stack_ffffffffffffff30;
  allocator<char> local_b1;
  string *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  Population *in_stack_ffffffffffffff60;
  undefined1 local_79;
  Parameters *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  Population *in_stack_ffffffffffffffa0;
  string local_40 [48];
  ANN *local_10;
  int local_4;
  
  size = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_4 = 0;
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  pAVar2 = (ANN *)operator_new(0x40);
  ANN::ANN(in_stack_fffffffffffffe70);
  local_10 = pAVar2;
  ANN::setInputSize(pAVar2,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  ANN::addLayer(in_stack_ffffffffffffff30,size,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  this = (BSA_SpikeEncodingSynapse *)operator_new(0x58);
  (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->spikes).
  super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->spikes).
  super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->spikes).
  super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Synapse).to_population = (Population *)0x0;
  this->param = (BSA_SpikeEncodingSynapse_param *)0x0;
  (this->super_Synapse)._vptr_Synapse = (_func_int **)0x0;
  (this->super_Synapse).from_population = (Population *)0x0;
  (this->input).
  super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  SignalGenerator_param::SignalGenerator_param((SignalGenerator_param *)this);
  (this->super_Synapse)._vptr_Synapse = (_func_int **)0x3fb999999999999a;
  pAVar2 = (ANN *)operator_new(0x60);
  this_03 = (ArtificialPopulation *)&local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  Population::Population
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  n_from = (Population *)operator_new(0x98);
  ArtificialPopulation::ArtificialPopulation(this_03,pAVar2);
  param = (BSA_SpikeEncodingSynapse_param *)operator_new(0x60);
  n_to = (Population *)&local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char *)n_from,(allocator<char> *)n_to);
  Population::Population
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::allocator<char>::~allocator(&local_b1);
  this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(long)param);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this_01 = (BSA_SpikeEncodingSynapse_param *)operator_new(0x20);
  this_01->scale = 0.0;
  *(undefined8 *)&this_01->window = 0;
  this_01->filter_length = 0.0;
  this_01->threshold = 0.0;
  BSA_SpikeEncodingSynapse_param::BSA_SpikeEncodingSynapse_param(this_01);
  this_01->threshold = 0.5;
  operator_new(0x98);
  BSA_SpikeEncodingSynapse::BSA_SpikeEncodingSynapse(this,n_from,n_to,param);
  operator_new(0x70);
  RateCodingSynapse::RateCodingSynapse((RateCodingSynapse *)this,n_from,n_to);
  this_02 = (Network *)operator_new(8);
  (this_02->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  Network_param::Network_param((Network_param *)this_02);
  (this_02->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f847ae147ae147b;
  Network::Network((Network *)this);
  Network::add(this_02,in_stack_fffffffffffffe68);
  Network::add(this_02,in_stack_fffffffffffffe68);
  Network::run((Network *)n_to,(double)param);
  local_4 = 0;
  Network::~Network(this_02);
  return local_4;
}

Assistant:

int main() 
{
    srand(time(NULL));

    ANN* ann = new ANN();
    ann->setInputSize(1);
    ann->addLayer(1, "tanh");

    // Populations
    SignalGenerator_param* paramp1 = new SignalGenerator_param();
    paramp1->f1 = 0.1;
    Population* p1 = new Population(1, "SignalGenerator", paramp1);

    ArtificialPopulation* p2 = new ArtificialPopulation(ann);

    Population* p3 = new Population(1, "izhikevich");
    cout << (long)p3 << endl;

    // Synapses
    BSA_SpikeEncodingSynapse_param* params1 = new BSA_SpikeEncodingSynapse_param();
    params1->threshold = 0.5;
    BSA_SpikeEncodingSynapse* s1 = new BSA_SpikeEncodingSynapse(p1, p3, params1);

    RateCodingSynapse* s2 = new RateCodingSynapse(p3, p2);


    // Create the network

    Network_param* n_param = new Network_param();
    n_param->dt = 0.01;
    Network n = Network();

    // Add the synapse to the network
    n.add(s1);
    n.add(s2);

    // Run the network for 100 second
    n.run(100.0);
    
    return 0;
}